

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O1

int __thiscall SpinLock::SpinLoop(SpinLock *this)

{
  bool bVar1;
  int iVar2;
  
  if (((this->lockword_).super___atomic_base<int>._M_i != 0 & adaptive_spin_count) == 1) {
    iVar2 = 1000;
    if ((adaptive_spin_count & 1) == 0) {
      iVar2 = 0;
    }
    do {
      if ((this->lockword_).super___atomic_base<int>._M_i == 0) break;
      bVar1 = 2 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  }
  LOCK();
  iVar2 = (this->lockword_).super___atomic_base<int>._M_i;
  if (iVar2 == 0) {
    (this->lockword_).super___atomic_base<int>._M_i = 2;
    iVar2 = 0;
  }
  UNLOCK();
  return iVar2;
}

Assistant:

int SpinLock::SpinLoop() {
  int c = adaptive_spin_count;
  while (lockword_.load(std::memory_order_relaxed) != kSpinLockFree && --c > 0) {
    SpinlockPause();
  }
  int old = kSpinLockFree;
  lockword_.compare_exchange_strong(old, kSpinLockSleeper, std::memory_order_acquire);
  // note, that we try to set lock word to 'have sleeper' state might
  // look unnecessary, but:
  //
  // *) pay attention to second call to SpinLoop at the bottom of SlowLock loop below
  //
  // *) note, that we get there after sleeping in SpinLockDelay and
  //    getting woken by Unlock
  //
  // *) also note, that we don't "count" sleepers, so when unlock
  //    awakes us, it also sets lock word to "free". So we risk
  //    forgetting other sleepers. And to prevent this, we become
  //    "designated waker", by setting lock word to "have sleeper". So
  //    then when we unlock, we also wake up someone.
  return old;
}